

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O2

int __thiscall asl::PacketSocket_::readFrom(PacketSocket_ *this,InetAddress *a,void *data,int n)

{
  sockaddr *__addr;
  ssize_t sVar1;
  socklen_t len;
  InetAddress local_38;
  
  if (*(int *)&(this->super_Socket_).super_SmartObject_.field_0xc < 0) {
    Socket_::init(&this->super_Socket_,(EVP_PKEY_CTX *)0x0);
  }
  InetAddress::InetAddress(&local_38,(this->super_Socket_)._family);
  InetAddress::operator=(a,&local_38);
  Array<unsigned_char>::~Array(&local_38._data);
  __addr = (sockaddr *)(a->_data)._a;
  local_38._data._a._0_2_ = __addr[-1].sa_family;
  local_38._data._a._2_1_ = __addr[-1].sa_data[0];
  local_38._data._a._3_1_ = __addr[-1].sa_data[1];
  sVar1 = recvfrom(*(int *)&(this->super_Socket_).super_SmartObject_.field_0xc,data,(long)n,0,__addr
                   ,(socklen_t *)&local_38);
  return (int)sVar1;
}

Assistant:

int PacketSocket_::readFrom(InetAddress& a, void* data, int n)
{
	if (_handle < 0)
		init();
	a = InetAddress(_family);
	socklen_t len = (socklen_t)a.length();
	int r= recvfrom(_handle, (char*)data, n, 0, (sockaddr*)a.ptr(), &len);
	return r;
}